

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O2

void __thiscall
boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>::on
          (reporter<boost::ext::ut::v1_1_8::printer> *this,test_end param_1)

{
  size_t *psVar1;
  printer *ppVar2;
  char *pcVar3;
  long lStack_20;
  
  if (this->fails_ < (this->asserts_).fail) {
    psVar1 = &(this->tests_).fail;
    *psVar1 = *psVar1 + 1;
    std::operator<<((ostream *)&(this->printer_).field_0x40,'\n');
    pcVar3 = "FAILED";
    lStack_20 = 0x50;
  }
  else {
    (this->tests_).pass = (this->tests_).pass + 1;
    pcVar3 = "PASSED";
    lStack_20 = 0x40;
  }
  ppVar2 = printer::operator<<(&this->printer_,
                               (basic_string_view<char,_std::char_traits<char>_> *)
                               ((long)&(this->tests_).pass + lStack_20));
  std::operator<<((ostream *)&ppVar2->field_0x40,pcVar3);
  ppVar2 = printer::operator<<(ppVar2,(basic_string_view<char,_std::char_traits<char>_> *)
                                      &this->printer_);
  std::operator<<((ostream *)&ppVar2->field_0x40,'\n');
  return;
}

Assistant:

auto on(events::test_end) -> void {
      if (asserts_.fail > fails_) {
        ++tests_.fail;
        printer_ << '\n'
                 << printer_.colors().fail << "FAILED" << printer_.colors().none
                 << '\n';
      } else {
        ++tests_.pass;
        printer_ << printer_.colors().pass << "PASSED" << printer_.colors().none
                 << '\n';
      }
    }